

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::restrictInteriorNodes
          (MLNodeLaplacian *this,int camrlev,MultiFab *crhs,MultiFab *a_frhs)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  LinOpBCType LVar1;
  LinOpBCType LVar2;
  LinOpBCType LVar3;
  undefined8 uVar4;
  pointer pVVar5;
  Geometry *this_00;
  pointer paVar6;
  pointer paVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  pointer *ppbVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int ioff;
  int iVar41;
  int iVar42;
  int iVar43;
  bool bVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  undefined1 auVar66 [16];
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar115;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar124;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  double dVar143;
  double dVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  double dVar149;
  double dVar150;
  double dVar151;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  double dVar152;
  double dVar164;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  double dVar165;
  double dVar166;
  double dVar167;
  undefined1 auVar169 [16];
  double dVar168;
  double dVar173;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  double dVar174;
  double dVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  double dVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  double dVar187;
  double dVar188;
  Periodicity PVar189;
  Box bx;
  MFIter mfi_1;
  MultiFab tmp_crhs;
  MFItInfo mfi_info;
  MultiFab cfine;
  Box local_804;
  double local_7e8;
  double dStack_7e0;
  FabArray<amrex::FArrayBox> *local_7d0;
  double *local_7c8;
  double *local_7c0;
  double *local_7b8;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> local_7b0;
  _Head_base<0UL,_amrex::LayoutData<int>_*,_false> local_7a8;
  long local_7a0;
  double local_798;
  double dStack_790;
  MLNodeLaplacian *local_788;
  undefined **local_780;
  long local_778;
  ulong local_770;
  long local_768;
  long local_760;
  double local_758;
  undefined8 uStack_750;
  FabArray<amrex::FArrayBox> *local_748;
  ulong local_740;
  long local_738;
  FabArray<amrex::FArrayBox> *local_730;
  double *local_728;
  double *local_720;
  double *local_718;
  double *local_710;
  undefined **local_708;
  undefined **local_700;
  undefined **local_6f8;
  uint local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  Array4<const_double> local_6d8;
  Array4<const_double> local_698;
  undefined8 local_658;
  int iStack_650;
  int aiStack_64c [2];
  undefined8 uStack_644;
  undefined1 local_638 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_628;
  int local_610;
  Vector<int,_std::allocator<int>_> *local_5f8;
  long local_5d8;
  ulong local_5d0;
  long local_5c8;
  long local_5c0;
  undefined **local_5b8;
  undefined **local_5b0;
  double *local_5a8;
  long local_5a0;
  long local_598;
  long local_590;
  long local_588;
  undefined **local_580;
  undefined **local_578;
  double *local_570;
  double local_568;
  undefined8 uStack_560;
  double *local_558;
  undefined8 uStack_550;
  double *local_548;
  undefined8 uStack_540;
  double *local_538;
  undefined8 uStack_530;
  double *local_528;
  undefined8 uStack_520;
  double local_518;
  undefined8 uStack_510;
  double local_508;
  undefined8 uStack_500;
  Geometry *local_4f8;
  pointer local_4f0;
  long local_4e8;
  FabArray<amrex::IArrayBox> *local_4e0;
  ulong local_4d8;
  long local_4d0;
  long local_4c8;
  long local_4c0;
  long local_4b8;
  long local_4b0;
  ulong local_4a8;
  long local_4a0;
  long local_498;
  long local_490;
  long local_488;
  long local_480;
  long local_478;
  long local_470;
  double *local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  double *local_448;
  double *local_440;
  double *local_438;
  double *local_430;
  double *local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  double *local_408;
  double *local_400;
  double *local_3f8;
  double *local_3f0;
  double *local_3e8;
  double *local_3e0;
  double *local_3d8;
  double *local_3d0;
  double *local_3c8;
  double *local_3c0;
  undefined **local_3b8;
  double *local_3b0;
  undefined **local_3a8;
  double *local_3a0;
  long local_398;
  Array4<const_double> local_390;
  FabArray<amrex::FArrayBox> local_350;
  MFItInfo local_1cc;
  undefined1 local_1b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8 [15];
  
  bxs = &(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  local_5d8 = (long)camrlev;
  uVar13 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[camrlev];
  uVar4 = *(undefined8 *)(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
  local_5d0 = (ulong)uVar13;
  iVar25 = uVar13 - 1;
  local_788 = this;
  local_748 = &crhs->super_FabArray<amrex::FArrayBox>;
  if ((((int)uVar4 < iVar25) || ((int)((ulong)uVar4 >> 0x20) < iVar25)) ||
     ((a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] < iVar25)) {
    this_01 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    local_1b8._0_8_ = (_func_int **)0x1;
    local_1b8._8_8_ = (Arena *)0x0;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_350.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)&PTR__FabFactory_008378d0;
    MultiFab::MultiFab((MultiFab *)this_01,bxs,dm,1,iVar25,(MFInfo *)local_1b8,
                       (FabFactory<amrex::FArrayBox> *)&local_350);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_1a8);
    local_7d0 = this_01;
    MultiFab::Copy((MultiFab *)this_01,a_frhs,0,0,1,0);
  }
  else {
    local_7d0 = (FabArray<amrex::FArrayBox> *)0x0;
    this_01 = &a_frhs->super_FabArray<amrex::FArrayBox>;
  }
  pVVar5 = (local_788->super_MLNodeLinOp).super_MLLinOp.m_geom.
           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4f8 = *(Geometry **)
               &pVVar5[local_5d8].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_4e8 = (long)((int)local_5d8 + 1);
  this_00 = *(Geometry **)
             &pVVar5[local_4e8].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_658 = *(undefined8 *)(this_00->domain).smallend.vect;
  uVar4 = *(undefined8 *)((this_00->domain).smallend.vect + 2);
  aiStack_64c[1] = (int)((ulong)*(undefined8 *)(this_00->domain).bigend.vect >> 0x20);
  uStack_644 = *(undefined8 *)((this_00->domain).bigend.vect + 2);
  iStack_650 = (int)uVar4;
  aiStack_64c[0] = (int)((ulong)uVar4 >> 0x20);
  lVar19 = 0;
  do {
    if ((uStack_644._4_4_ >> ((uint)lVar19 & 0x1f) & 1) == 0) {
      aiStack_64c[lVar19] = aiStack_64c[lVar19] + 1;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  uStack_644 = CONCAT44(7,(undefined4)uStack_644);
  paVar6 = (local_788->super_MLNodeLinOp).super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar7 = (local_788->super_MLNodeLinOp).super_MLLinOp.m_hibc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_7a0 = CONCAT44(local_7a0._4_4_,paVar6->_M_elems[0]);
  LVar1 = paVar6->_M_elems[1];
  LVar2 = paVar6->_M_elems[2];
  local_7a8._M_head_impl._0_4_ = paVar7->_M_elems[0];
  local_7b0._M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl._0_4_ = paVar7->_M_elems[1];
  LVar3 = paVar7->_M_elems[2];
  local_4e0 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(local_788->super_MLNodeLinOp).m_dirichlet_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_4e8].
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  local_4f0 = (local_788->m_nosigma_stencil).
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  amrex::coarsen((BoxArray *)&local_350,bxs,(int)local_5d0);
  local_638._1_7_ = 0;
  local_638[0] = true;
  local_638._8_4_ = 0;
  local_638._12_4_ = 0;
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.p = (double *)&PTR__FabFactory_008378d0;
  MultiFab::MultiFab((MultiFab *)local_1b8,(BoxArray *)&local_350,dm,1,0,(MFInfo *)local_638,
                     (FabFactory<amrex::FArrayBox> *)&local_6d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_628);
  BoxArray::~BoxArray((BoxArray *)&local_350);
  FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
            (this_01,0.0,0,(this_01->super_FabArrayBase).n_comp);
  local_350.super_FabArrayBase._0_12_ = Geometry::periodicity(this_00);
  FabArray<amrex::FArrayBox>::FillBoundary<double>(this_01,(Periodicity *)&local_350,false);
  MFIter::MFIter((MFIter *)&local_350,(FabArrayBase *)local_1b8,true);
  iVar12 = aiStack_64c[0];
  iVar25 = iStack_650;
  if (local_350.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0] <
      local_350.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) {
    local_760 = CONCAT44(local_760._4_4_,(undefined4)local_658);
    local_768 = CONCAT44(local_768._4_4_,local_658._4_4_);
    local_770 = CONCAT44(local_770._4_4_,aiStack_64c[1]);
    local_778 = CONCAT44(local_778._4_4_,(undefined4)uStack_644);
    local_730 = this_01;
    do {
      MFIter::tilebox(&local_804,(MFIter *)&local_350);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_638,(FabArray<amrex::FArrayBox> *)local_1b8,
                 (MFIter *)&local_350);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_6d8,this_01,(MFIter *)&local_350);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&local_698,local_4e0,(MFIter *)&local_350);
      if ((local_788->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
        if ((int)local_5d0 == 2) {
          local_758 = (double)CONCAT44(local_758._4_4_,local_804.bigend.vect[2]);
          if (local_804.smallend.vect[2] <= local_804.bigend.vect[2]) {
            local_7c8 = (double *)(ulong)(uint)local_804.bigend.vect[1];
            local_7c0 = (double *)CONCAT44(local_7c0._4_4_,local_804.smallend.vect[0] * 2);
            local_798 = (double)CONCAT44(local_798._4_4_,local_804.bigend.vect[0] + 1U);
            uVar13 = local_804.smallend.vect[2];
            do {
              if (local_804.smallend.vect[1] <= local_804.bigend.vect[1]) {
                lVar19 = (long)(int)uVar13 * 2;
                local_7b8 = (double *)
                            ((lVar19 - local_698.begin.z) * local_698.kstride * 4 +
                            (long)local_698.p);
                local_7e8 = (double)(long)local_804.smallend.vect[1];
                do {
                  if (local_804.smallend.vect[0] <= local_804.bigend.vect[0]) {
                    lVar17 = (long)local_804.smallend.vect[0];
                    iVar22 = local_804.smallend.vect[0] * 2;
                    do {
                      dVar55 = 0.0;
                      dVar54 = 0.0;
                      if (*(int *)((long)local_7b8 +
                                  (lVar17 * 2 - (long)local_698.begin.x) * 4 +
                                  ((long)local_7e8 * 2 - (long)local_698.begin.y) *
                                  local_698.jstride * 4) == 0) {
                        iVar28 = -1;
                        do {
                          iVar14 = -iVar28;
                          if (iVar28 < 1) {
                            iVar14 = iVar28;
                          }
                          iVar8 = (int)lVar19;
                          iVar26 = iVar28 + iVar8;
                          iVar42 = -1;
                          do {
                            iVar15 = -iVar42;
                            if (iVar42 < 1) {
                              iVar15 = iVar42;
                            }
                            iVar9 = (int)((long)local_7e8 * 2);
                            iVar16 = iVar42 + iVar9;
                            iVar41 = -1;
                            do {
                              iVar10 = -iVar41;
                              if (iVar41 < 1) {
                                iVar10 = iVar41;
                              }
                              iVar43 = iVar22 + iVar41;
                              if (((iVar43 < (int)local_760) &&
                                  (((int)local_7a0 == 0x66 || ((int)local_7a0 == 0x6a)))) ||
                                 ((iVar12 < iVar43 &&
                                  (((LinOpBCType)local_7a8._M_head_impl == 0x66 ||
                                   ((LinOpBCType)local_7a8._M_head_impl == 0x6a)))))) {
                                iVar43 = (int)(lVar17 * 2) - iVar41;
                              }
                              if (((iVar16 < (int)local_768) &&
                                  ((LVar1 == Neumann || (LVar1 == inflow)))) ||
                                 ((iVar39 = iVar16, (int)local_770 < iVar16 &&
                                  (((LinOpBCType)
                                    local_7b0._M_t.
                                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl
                                    == 0x6a ||
                                   ((LinOpBCType)
                                    local_7b0._M_t.
                                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl
                                    == 0x66)))))) {
                                iVar39 = iVar9 - iVar42;
                              }
                              if (((iVar26 < iVar25) && ((LVar2 == Neumann || (LVar2 == inflow))))
                                 || ((iVar27 = iVar26, (int)local_778 < iVar26 &&
                                     ((LVar3 == inflow || (LVar3 == Neumann)))))) {
                                iVar27 = iVar8 - iVar28;
                              }
                              dVar54 = dVar54 + (double)(iVar10 + 2) * (double)(iVar15 + 2) *
                                                (double)(iVar14 + 2) *
                                                (double)local_6d8.p
                                                        [((long)iVar39 - (long)local_6d8.begin.y) *
                                                         local_6d8.jstride +
                                                         ((long)iVar43 - (long)local_6d8.begin.x) +
                                                         ((long)iVar27 - (long)local_6d8.begin.z) *
                                                         local_6d8.kstride];
                              iVar41 = iVar41 + 1;
                            } while (iVar41 != 2);
                            iVar42 = iVar42 + 1;
                          } while (iVar42 != 2);
                          iVar28 = iVar28 + 1;
                        } while (iVar28 != 2);
                        dVar55 = dVar54 * 0.015625;
                        this_01 = local_730;
                      }
                      *(double *)
                       (((long)local_7e8 -
                        (long)local_628.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        CONCAT44(local_638._12_4_,local_638._8_4_) * 8 +
                        CONCAT71(local_638._1_7_,local_638[0]) +
                        ((long)(int)uVar13 - (long)local_610) *
                        (long)local_628.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start * 8 +
                       (lVar17 - (int)local_628.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8) =
                           dVar55;
                      lVar17 = lVar17 + 1;
                      iVar22 = iVar22 + 2;
                    } while (local_804.bigend.vect[0] + 1U != (int)lVar17);
                  }
                  local_7e8 = (double)((long)local_7e8 + 1);
                } while (local_804.bigend.vect[1] + 1U != SUB84(local_7e8,0));
              }
              bVar44 = uVar13 != local_804.bigend.vect[2];
              uVar13 = uVar13 + 1;
            } while (bVar44);
          }
        }
        else {
          local_758 = (double)CONCAT44(local_758._4_4_,local_804.bigend.vect[2]);
          if (local_804.smallend.vect[2] <= local_804.bigend.vect[2]) {
            local_7c8 = (double *)(ulong)(uint)local_804.bigend.vect[1];
            local_7c0 = (double *)CONCAT44(local_7c0._4_4_,local_804.smallend.vect[0] * 4);
            local_798 = (double)CONCAT44(local_798._4_4_,local_804.bigend.vect[0] + 1U);
            uVar13 = local_804.smallend.vect[2];
            do {
              if (local_804.smallend.vect[1] <= local_804.bigend.vect[1]) {
                lVar19 = (long)(int)uVar13 * 4;
                local_7b8 = (double *)
                            ((lVar19 - local_698.begin.z) * local_698.kstride * 4 +
                            (long)local_698.p);
                local_7e8 = (double)(long)local_804.smallend.vect[1];
                do {
                  if (local_804.smallend.vect[0] <= local_804.bigend.vect[0]) {
                    lVar17 = (long)local_804.smallend.vect[0];
                    iVar22 = local_804.smallend.vect[0] * 4;
                    do {
                      dVar54 = 0.0;
                      if (*(int *)((long)local_7b8 +
                                  (lVar17 * 4 - (long)local_698.begin.x) * 4 +
                                  ((long)local_7e8 * 4 - (long)local_698.begin.y) *
                                  local_698.jstride * 4) == 0) {
                        iVar28 = -3;
                        do {
                          iVar14 = -iVar28;
                          if (iVar28 < 1) {
                            iVar14 = iVar28;
                          }
                          iVar8 = (int)lVar19;
                          iVar26 = iVar28 + iVar8;
                          iVar42 = -3;
                          do {
                            iVar15 = -iVar42;
                            if (iVar42 < 1) {
                              iVar15 = iVar42;
                            }
                            iVar9 = (int)((long)local_7e8 * 4);
                            iVar16 = iVar42 + iVar9;
                            iVar41 = -3;
                            do {
                              iVar10 = -iVar41;
                              if (iVar41 < 1) {
                                iVar10 = iVar41;
                              }
                              iVar43 = iVar22 + iVar41;
                              if (((iVar43 < (int)local_760) &&
                                  (((int)local_7a0 == 0x66 || ((int)local_7a0 == 0x6a)))) ||
                                 ((iVar12 < iVar43 &&
                                  (((LinOpBCType)local_7a8._M_head_impl == 0x66 ||
                                   ((LinOpBCType)local_7a8._M_head_impl == 0x6a)))))) {
                                iVar43 = (int)(lVar17 * 4) - iVar41;
                              }
                              if (((iVar16 < (int)local_768) &&
                                  ((LVar1 == Neumann || (LVar1 == inflow)))) ||
                                 ((iVar39 = iVar16, (int)local_770 < iVar16 &&
                                  (((LinOpBCType)
                                    local_7b0._M_t.
                                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl
                                    == 0x6a ||
                                   ((LinOpBCType)
                                    local_7b0._M_t.
                                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl
                                    == 0x66)))))) {
                                iVar39 = iVar9 - iVar42;
                              }
                              if (((iVar26 < iVar25) && ((LVar2 == Neumann || (LVar2 == inflow))))
                                 || ((iVar27 = iVar26, (int)local_778 < iVar26 &&
                                     ((LVar3 == inflow || (LVar3 == Neumann)))))) {
                                iVar27 = iVar8 - iVar28;
                              }
                              dVar54 = dVar54 + (double)(iVar10 + 4) * (double)(iVar15 + 4) *
                                                (double)(iVar14 + 4) *
                                                (double)local_6d8.p
                                                        [((long)iVar39 - (long)local_6d8.begin.y) *
                                                         local_6d8.jstride +
                                                         ((long)iVar43 - (long)local_6d8.begin.x) +
                                                         ((long)iVar27 - (long)local_6d8.begin.z) *
                                                         local_6d8.kstride];
                              iVar41 = iVar41 + 1;
                            } while (iVar41 != 4);
                            iVar42 = iVar42 + 1;
                          } while (iVar42 != 4);
                          iVar28 = iVar28 + 1;
                        } while (iVar28 != 4);
                        dVar54 = dVar54 * 0.000244140625;
                        this_01 = local_730;
                      }
                      *(double *)
                       (((long)local_7e8 -
                        (long)local_628.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        CONCAT44(local_638._12_4_,local_638._8_4_) * 8 +
                        CONCAT71(local_638._1_7_,local_638[0]) +
                        ((long)(int)uVar13 - (long)local_610) *
                        (long)local_628.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start * 8 +
                       (lVar17 - (int)local_628.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8) =
                           dVar54;
                      lVar17 = lVar17 + 1;
                      iVar22 = iVar22 + 4;
                    } while (local_804.bigend.vect[0] + 1U != (int)lVar17);
                  }
                  local_7e8 = (double)((long)local_7e8 + 1);
                } while (local_804.bigend.vect[1] + 1U != SUB84(local_7e8,0));
              }
              bVar44 = uVar13 != local_804.bigend.vect[2];
              uVar13 = uVar13 + 1;
            } while (bVar44);
          }
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_390,
                   (FabArray<amrex::FArrayBox> *)
                   local_4f0[local_4e8]._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                   (MFIter *)&local_350);
        local_6f0 = local_804.bigend.vect[2];
        this_01 = local_730;
        local_740 = (ulong)(uint)local_804.smallend.vect[2];
        if (local_804.smallend.vect[2] <= local_804.bigend.vect[2]) {
          local_4a8 = (ulong)(uint)local_804.bigend.vect[0];
          local_4d8 = (ulong)(uint)local_804.bigend.vect[1];
          local_5c8 = (long)local_804.smallend.vect[1];
          local_5c0 = (long)local_804.smallend.vect[0];
          local_6dc = local_804.bigend.vect[0] + 1;
          local_6e0 = local_804.bigend.vect[1] + 1;
          do {
            if (local_804.smallend.vect[1] <= local_804.bigend.vect[1]) {
              local_4b0 = (long)(int)(uint)local_740;
              local_4b8 = local_4b0 * 2;
              local_5a0 = (long)local_698.begin.x;
              local_4c0 = (long)local_698.begin.y;
              local_4d0 = local_698.jstride;
              local_4c8 = (local_4b8 - local_698.begin.z) * local_698.kstride * 4 +
                          (long)local_698.p;
              iVar22 = (int)local_4b8;
              local_6e4 = iVar22 + -2;
              local_6e8 = iVar22 + -1;
              local_6ec = iVar22 + 1;
              local_738 = local_5c8;
              do {
                if (local_804.smallend.vect[0] <= local_804.bigend.vect[0]) {
                  lVar18 = local_738 * 2;
                  local_598 = (local_738 -
                              local_628.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                              CONCAT44(local_638._12_4_,local_638._8_4_) * 8 +
                              CONCAT71(local_638._1_7_,local_638[0]) +
                              (local_4b0 - local_610) *
                              (long)local_628.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start * 8;
                  lVar29 = (long)local_6d8.begin.y;
                  local_6f8 = (undefined **)(local_6d8.p + (lVar18 - lVar29) * local_6d8.jstride);
                  lVar37 = (long)local_390.begin.y;
                  lVar19 = local_738 * 2 + -1;
                  lVar17 = local_738 * 2 + 1;
                  lVar35 = (lVar18 - lVar37) * local_390.jstride;
                  local_570 = local_390.p +
                              (((int)lVar18 - local_390.begin.y) + -2) * local_390.jstride;
                  local_468 = local_390.p + (lVar19 - lVar37) * local_390.jstride;
                  local_5a8 = local_390.p + (lVar17 - lVar37) * local_390.jstride;
                  local_578 = (undefined **)(local_6d8.p + (lVar19 - lVar29) * local_6d8.jstride);
                  local_580 = (undefined **)(local_6d8.p + (lVar17 - lVar29) * local_6d8.jstride);
                  lVar38 = (iVar22 - local_390.begin.z) * local_390.kstride;
                  lVar37 = (local_6e4 - local_390.begin.z) * local_390.kstride;
                  lVar30 = (local_6e8 - local_390.begin.z) * local_390.kstride;
                  lVar31 = (local_6ec - local_390.begin.z) * local_390.kstride;
                  local_588 = (iVar22 - local_6d8.begin.z) * local_6d8.kstride;
                  lVar17 = (local_6e8 - local_6d8.begin.z) * local_6d8.kstride;
                  lVar29 = (local_6ec - local_6d8.begin.z) * local_6d8.kstride;
                  local_470 = local_4c8 + (lVar18 - local_4c0) * local_698.jstride * 4;
                  local_478 = local_390.nstride * 8;
                  local_4a0 = local_390.nstride * 7;
                  local_590 = (long)local_390.begin.x;
                  local_480 = -local_590;
                  lVar18 = (long)local_6d8.begin.x;
                  local_780 = local_6f8 + local_588;
                  local_5b0 = local_578 + local_588;
                  local_5b8 = local_580 + local_588;
                  local_488 = local_390.nstride * 3;
                  local_490 = local_390.nstride * 6;
                  local_498 = (long)(int)local_628.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  lVar19 = local_5c0;
                  do {
                    uVar11 = lVar19 * 2;
                    dVar54 = 0.0;
                    if (*(int *)(local_470 + (uVar11 - local_5a0) * 4) == 0) {
                      lVar40 = uVar11 - lVar18;
                      lVar33 = (long)(((int)uVar11 - local_390.begin.x) + -2);
                      local_7c8 = local_390.p + lVar35 + lVar33 + lVar38;
                      lVar32 = uVar11 - 1;
                      lVar23 = lVar32 - local_590;
                      dVar54 = local_390.p[lVar35 + lVar23 + lVar38 + local_390.nstride];
                      if (((local_7c8[local_390.nstride] != 0.0) || (dVar54 != 0.0)) ||
                         (NAN(dVar54))) {
                        dVar54 = ((double)local_780[lVar32 - lVar18] * ABS(dVar54)) /
                                 (ABS(local_7c8[local_390.nstride]) + ABS(dVar54));
                      }
                      else {
                        dVar54 = (double)local_780[lVar32 - lVar18] * 0.5;
                      }
                      lVar24 = uVar11 - local_590;
                      uVar36 = uVar11 | 1;
                      dVar55 = local_390.p[lVar35 + lVar24 + lVar38 + local_390.nstride];
                      dVar56 = (local_390.p + lVar35 + lVar24 + lVar38 + local_390.nstride)[1];
                      if (((dVar55 != 0.0) || (NAN(dVar55))) || ((dVar56 != 0.0 || (NAN(dVar56)))))
                      {
                        dVar55 = ((double)local_780[uVar36 - lVar18] * ABS(dVar55)) /
                                 (ABS(dVar56) + ABS(dVar55));
                      }
                      else {
                        dVar55 = (double)local_780[uVar36 - lVar18] * 0.5;
                      }
                      local_420 = local_570 + lVar24;
                      dVar56 = local_420[lVar38 + local_390.nstride * 2];
                      dVar57 = local_468[lVar24 + lVar38 + local_390.nstride * 2];
                      if (((dVar56 != 0.0) || (NAN(dVar56))) || ((dVar57 != 0.0 || (NAN(dVar57)))))
                      {
                        dVar56 = ((double)local_5b0[lVar40] * ABS(dVar57)) /
                                 (ABS(dVar56) + ABS(dVar57));
                      }
                      else {
                        dVar56 = (double)local_5b0[lVar40] * 0.5;
                      }
                      dVar57 = local_390.p[lVar35 + lVar24 + lVar38 + local_390.nstride * 2];
                      local_438 = local_5a8 + lVar24;
                      dVar58 = local_438[lVar38 + local_390.nstride * 2];
                      if ((((dVar57 != 0.0) || (NAN(dVar57))) || (dVar58 != 0.0)) || (NAN(dVar58)))
                      {
                        dVar57 = ((double)local_5b8[lVar40] * ABS(dVar57)) /
                                 (ABS(dVar57) + ABS(dVar58));
                      }
                      else {
                        dVar57 = (double)local_5b8[lVar40] * 0.5;
                      }
                      dVar58 = local_390.p[lVar35 + lVar24 + lVar37 + local_390.nstride * 3];
                      dVar59 = local_390.p[lVar35 + lVar24 + lVar30 + local_390.nstride * 3];
                      if (((dVar58 != 0.0) || (NAN(dVar58))) || ((dVar59 != 0.0 || (NAN(dVar59)))))
                      {
                        dVar58 = ((double)local_6f8[lVar40 + lVar17] * ABS(dVar59)) /
                                 (ABS(dVar58) + ABS(dVar59));
                      }
                      else {
                        dVar58 = (double)local_6f8[lVar40 + lVar17] * 0.5;
                      }
                      lVar20 = uVar11 + local_480 + 1;
                      dVar59 = local_390.p[lVar35 + lVar24 + lVar38 + local_390.nstride * 3];
                      local_430 = local_390.p + lVar35 + lVar24 + lVar31;
                      dVar45 = local_430[local_390.nstride * 3];
                      if (((dVar59 != 0.0) || (NAN(dVar59))) || ((dVar45 != 0.0 || (NAN(dVar45)))))
                      {
                        dVar59 = ((double)local_6f8[lVar40 + lVar29] * ABS(dVar59)) /
                                 (ABS(dVar59) + ABS(dVar45));
                      }
                      else {
                        dVar59 = (double)local_6f8[lVar40 + lVar29] * 0.5;
                      }
                      local_7b8 = local_468 + lVar33;
                      local_3e0 = local_7b8 + lVar38;
                      local_3a0 = local_570 + lVar33;
                      local_3d0 = local_3a0 + lVar38;
                      dVar90 = ABS(local_3d0[local_390.nstride * 4]);
                      dVar60 = ABS(local_3e0[local_390.nstride * 4]);
                      local_3e8 = local_468 + lVar23 + lVar38;
                      local_7c0 = local_570 + lVar23;
                      local_3d8 = local_7c0 + lVar38;
                      dVar116 = ABS(local_3d8[local_390.nstride * 4]);
                      dVar99 = ABS(local_3e8[local_390.nstride * 4]);
                      dVar125 = ABS(local_3d8[local_390.nstride * 2]) / (dVar90 + dVar116 + 1e-100);
                      dVar133 = ABS(local_3e8[local_390.nstride * 2]) / (dVar60 + dVar99 + 1e-100);
                      dVar67 = ABS(local_3e0[local_390.nstride]) / (dVar90 + dVar60 + 1e-100) + 1.0;
                      dVar85 = ABS(local_3e8[local_390.nstride]) / (dVar116 + dVar99 + 1e-100) + 1.0
                      ;
                      dVar99 = (dVar85 + dVar133) * dVar99;
                      lVar32 = lVar32 - lVar18;
                      local_3a8 = local_578 + lVar32;
                      dVar91 = ABS(local_420[lVar38 + local_390.nstride * 4]);
                      dVar45 = ABS(local_468[lVar24 + lVar38 + local_390.nstride * 4]);
                      local_418 = local_468 + lVar20 + lVar38;
                      local_3b0 = local_570 + lVar20;
                      local_410 = local_3b0 + lVar38;
                      dVar126 = ABS(local_410[local_390.nstride * 4]);
                      dVar100 = ABS(local_418[local_390.nstride * 4]);
                      dVar117 = ABS(local_410[local_390.nstride * 2]) / (dVar91 + dVar126 + 1e-100);
                      dVar134 = ABS(local_418[local_390.nstride * 2]) / (dVar45 + dVar100 + 1e-100);
                      dVar68 = ABS(local_468[lVar24 + lVar38 + local_390.nstride]) /
                               (dVar91 + dVar45 + 1e-100) + 1.0;
                      dVar86 = ABS(local_418[local_390.nstride]) / (dVar126 + dVar100 + 1e-100) +
                               1.0;
                      dVar45 = (dVar68 + dVar134) * dVar45;
                      lVar34 = uVar36 - lVar18;
                      local_700 = local_578 + lVar34;
                      local_3c0 = local_5a8 + lVar33;
                      local_448 = local_3c0 + lVar38;
                      dVar101 = ABS(local_7c8[local_390.nstride * 4]);
                      dVar92 = ABS(local_448[local_390.nstride * 4]);
                      local_428 = local_5a8 + lVar23;
                      local_440 = local_428 + lVar38;
                      dVar127 = ABS(local_390.p[lVar35 + lVar23 + lVar38 + local_390.nstride * 4]);
                      dVar118 = ABS(local_440[local_390.nstride * 4]);
                      dVar61 = ABS(local_390.p[lVar35 + lVar23 + lVar38 + local_390.nstride * 2]) /
                               (dVar101 + dVar127 + 1e-100);
                      dVar135 = ABS(local_440[local_390.nstride * 2]) / (dVar92 + dVar118 + 1e-100);
                      dVar69 = ABS(local_448[local_390.nstride]) / (dVar101 + dVar92 + 1e-100) + 1.0
                      ;
                      dVar87 = ABS(local_440[local_390.nstride]) / (dVar127 + dVar118 + 1e-100) +
                               1.0;
                      dVar127 = (dVar61 + dVar87) * dVar127;
                      local_708 = local_580 + lVar32;
                      dVar46 = ABS(local_438[lVar38 + local_390.nstride * 4]);
                      dVar102 = ABS(local_390.p[lVar35 + lVar24 + lVar38 + local_390.nstride * 4]);
                      local_3c8 = local_5a8 + lVar20;
                      local_450 = local_3c8 + lVar38;
                      dVar119 = ABS(local_450[local_390.nstride * 4]);
                      dVar128 = ABS(local_390.p[lVar35 + lVar20 + lVar38 + local_390.nstride * 4]);
                      dVar93 = ABS(local_390.p[lVar35 + lVar20 + lVar38 + local_390.nstride * 2]) /
                               (dVar102 + dVar128 + 1e-100);
                      dVar136 = ABS(local_450[local_390.nstride * 2]) / (dVar46 + dVar119 + 1e-100);
                      dVar70 = ABS(local_438[lVar38 + local_390.nstride]) /
                               (dVar46 + dVar102 + 1e-100) + 1.0;
                      dVar102 = (dVar70 + dVar93) * dVar102;
                      dVar88 = ABS(local_450[local_390.nstride]) / (dVar119 + dVar128 + 1e-100) +
                               1.0;
                      local_3b8 = local_580 + lVar34;
                      local_400 = local_390.p + lVar35 + lVar33 + lVar30;
                      local_3f0 = local_390.p + lVar35 + lVar33 + lVar37;
                      dVar62 = ABS(local_3f0[local_390.nstride * 5]);
                      dVar71 = ABS(local_400[local_390.nstride * 5]);
                      local_3f8 = local_390.p + lVar35 + lVar23 + lVar30;
                      local_408 = local_390.p + lVar35 + lVar23 + lVar37;
                      dVar174 = ABS(local_408[local_390.nstride * 5]);
                      dVar165 = ABS(local_3f8[local_390.nstride * 5]);
                      dVar182 = ABS(local_408[local_390.nstride * 3]) / (dVar62 + dVar174 + 1e-100);
                      dVar187 = ABS(local_3f8[local_390.nstride * 3]) / (dVar71 + dVar165 + 1e-100);
                      dVar89 = ABS(local_400[local_390.nstride]) / (dVar62 + dVar71 + 1e-100) + 1.0;
                      local_458 = local_390.p + lVar35 + lVar33 + lVar31;
                      dVar47 = ABS(local_458[local_390.nstride * 5]);
                      uStack_520 = 0;
                      dVar149 = ABS(local_7c8[local_390.nstride * 5]);
                      local_460 = local_390.p + lVar35 + lVar23 + lVar31;
                      dVar63 = ABS(local_460[local_390.nstride * 5]);
                      uStack_530 = 0;
                      dVar48 = ABS(local_390.p[lVar35 + lVar23 + lVar38 + local_390.nstride * 5]);
                      dVar64 = ABS(local_390.p[lVar35 + lVar23 + lVar38 + local_390.nstride * 3]) /
                               (dVar149 + dVar48 + 1e-100);
                      dVar94 = ABS(local_458[local_390.nstride]) / (dVar47 + dVar149 + 1e-100) + 1.0
                      ;
                      dVar72 = ABS(local_460[local_390.nstride]) / (dVar63 + dVar48 + 1e-100) + 1.0;
                      uStack_550 = 0;
                      dVar48 = (dVar64 + dVar72) * dVar48;
                      dVar143 = ABS(local_3f8[local_390.nstride]) / (dVar174 + dVar165 + 1e-100) +
                                1.0;
                      dVar165 = (dVar143 + dVar187) * dVar165;
                      dVar103 = ABS(local_390.p[lVar35 + lVar24 + lVar37 + local_390.nstride * 5]);
                      dVar49 = ABS(local_390.p[lVar35 + lVar24 + lVar30 + local_390.nstride * 5]);
                      local_710 = local_390.p + lVar35 + lVar20 + lVar30;
                      local_718 = local_390.p + lVar35 + lVar20 + lVar37;
                      dVar144 = ABS(local_718[local_390.nstride * 5]);
                      dVar73 = ABS(local_710[local_390.nstride * 5]);
                      uStack_540 = 0;
                      dVar188 = ABS(local_718[local_390.nstride * 3]) / (dVar103 + dVar144 + 1e-100)
                      ;
                      dVar74 = ABS(local_710[local_390.nstride * 3]) / (dVar49 + dVar73 + 1e-100);
                      dVar166 = ABS(local_390.p[lVar35 + lVar24 + lVar30 + local_390.nstride]) /
                                (dVar103 + dVar49 + 1e-100) + 1.0;
                      dVar175 = ABS(local_710[local_390.nstride]) / (dVar144 + dVar73 + 1e-100) +
                                1.0;
                      dVar49 = (dVar166 + dVar74) * dVar49;
                      dVar104 = ABS(local_460[local_390.nstride * 3]) / (dVar47 + dVar63 + 1e-100);
                      dVar95 = ABS(local_430[local_390.nstride * 5]);
                      dVar50 = ABS(local_390.p[lVar35 + lVar24 + lVar38 + local_390.nstride * 5]);
                      dVar120 = ABS(local_390.p[lVar35 + lVar20 + lVar31 + local_390.nstride * 5]);
                      dVar137 = ABS(local_390.p[lVar35 + lVar20 + lVar38 + local_390.nstride * 5]);
                      dVar150 = ABS(local_390.p[lVar35 + lVar20 + lVar38 + local_390.nstride * 3]) /
                                (dVar50 + dVar137 + 1e-100);
                      dVar167 = ABS(local_390.p[lVar35 + lVar20 + lVar31 + local_390.nstride * 3]) /
                                (dVar95 + dVar120 + 1e-100);
                      dVar75 = ABS(local_430[local_390.nstride]) / (dVar95 + dVar50 + 1e-100) + 1.0;
                      dVar50 = (dVar75 + dVar150) * dVar50;
                      dVar105 = ABS(local_390.p[lVar35 + lVar20 + lVar31 + local_390.nstride]) /
                                (dVar120 + dVar137 + 1e-100) + 1.0;
                      local_528 = local_420 + lVar30;
                      dVar151 = ABS(local_528[local_390.nstride * 6]);
                      local_548 = local_438 + lVar30;
                      dVar76 = ABS(local_548[local_390.nstride * 6]);
                      local_720 = local_420 + lVar37;
                      dVar106 = ABS(local_720[local_390.nstride * 6]);
                      dVar115 = ABS(local_390.p[lVar35 + lVar24 + lVar37 + local_390.nstride * 6]);
                      dVar51 = ABS(local_528[local_390.nstride * 2]) / (dVar106 + dVar151 + 1e-100)
                               + 1.0;
                      local_728 = local_468 + lVar24 + lVar30;
                      dVar121 = ABS(local_728[local_390.nstride * 6]);
                      dVar124 = ABS(local_390.p[lVar35 + lVar24 + lVar30 + local_390.nstride * 6]);
                      auVar96._0_8_ = ABS(local_728[local_390.nstride * 3]);
                      auVar96._8_8_ = ABS(local_548[local_390.nstride * 3]);
                      auVar169._0_8_ = dVar121 + dVar151 + 1e-100;
                      auVar169._8_8_ = dVar76 + dVar124 + 1e-100;
                      auVar97 = divpd(auVar96,auVar169);
                      auVar153._0_8_ = ABS(local_728[local_390.nstride * 2]);
                      auVar153._8_8_ =
                           ABS(local_390.p[lVar35 + lVar24 + lVar30 + local_390.nstride * 2]);
                      local_538 = local_468 + lVar24 + lVar37;
                      local_558 = local_438 + lVar37;
                      dVar168 = ABS(local_538[local_390.nstride * 6]);
                      dVar173 = ABS(local_558[local_390.nstride * 6]);
                      auVar183._0_8_ = dVar168 + dVar121 + 1e-100;
                      auVar183._8_8_ = dVar124 + dVar115 + 1e-100;
                      auVar154 = divpd(auVar153,auVar183);
                      auVar176._0_8_ = ABS(local_538[local_390.nstride * 3]);
                      auVar176._8_8_ = ABS(local_558[local_390.nstride * 3]);
                      auVar184._0_8_ = dVar106 + dVar168 + 1e-100;
                      auVar184._8_8_ = dVar115 + dVar173 + 1e-100;
                      auVar177 = divpd(auVar176,auVar184);
                      dVar152 = auVar154._0_8_ + 1.0;
                      dVar164 = auVar154._8_8_ + 1.0;
                      dVar65 = ABS(local_548[local_390.nstride * 2]) / (dVar173 + dVar76 + 1e-100) +
                               1.0;
                      dVar121 = (auVar97._0_8_ + dVar152) * dVar121;
                      dVar124 = (auVar97._8_8_ + dVar164) * dVar124;
                      auVar154._0_8_ = (double)local_578[lVar40 + lVar17] * dVar121;
                      auVar154._8_8_ = (double)local_580[lVar40 + lVar17] * dVar124;
                      auVar107._0_8_ =
                           dVar121 + (dVar51 + auVar97._0_8_) * dVar151 +
                                     (dVar152 + auVar177._0_8_) * dVar168 +
                                     (dVar51 + auVar177._0_8_) * dVar106 + 1e-100;
                      auVar107._8_8_ =
                           (auVar97._8_8_ + dVar65) * dVar76 +
                           dVar124 + (dVar65 + auVar177._8_8_) * dVar173 +
                                     (dVar164 + auVar177._8_8_) * dVar115 + 1e-100;
                      auVar97 = divpd(auVar154,auVar107);
                      dVar51 = ABS(local_420[lVar38 + local_390.nstride * 6]);
                      dVar115 = ABS(local_438[lVar38 + local_390.nstride * 6]);
                      dVar106 = ABS(local_420[lVar31 + local_390.nstride * 6]);
                      dVar121 = ABS(local_430[local_390.nstride * 6]);
                      dVar173 = ABS(local_420[lVar31 + local_390.nstride * 2]) /
                                (dVar106 + dVar51 + 1e-100) + 1.0;
                      dVar65 = ABS(local_468[lVar24 + lVar38 + local_390.nstride * 6]);
                      dVar76 = ABS(local_390.p[lVar35 + lVar24 + lVar38 + local_390.nstride * 6]);
                      auVar155._0_8_ = ABS(local_468[lVar24 + lVar38 + local_390.nstride * 3]);
                      auVar155._8_8_ = ABS(local_438[lVar38 + local_390.nstride * 3]);
                      auVar108._0_8_ = dVar65 + dVar51 + 1e-100;
                      auVar108._8_8_ = dVar115 + dVar76 + 1e-100;
                      auVar156 = divpd(auVar155,auVar108);
                      auVar122._0_8_ = ABS(local_468[lVar24 + lVar31 + local_390.nstride * 2]);
                      auVar122._8_8_ = ABS(local_430[local_390.nstride * 2]);
                      dVar152 = ABS(local_468[lVar24 + lVar31 + local_390.nstride * 6]);
                      dVar164 = ABS(local_438[lVar31 + local_390.nstride * 6]);
                      auVar130._0_8_ = dVar152 + dVar65 + 1e-100;
                      auVar130._8_8_ = dVar76 + dVar121 + 1e-100;
                      auVar177 = divpd(auVar122,auVar130);
                      local_518 = local_438[lVar31 + local_390.nstride * 7];
                      uStack_510 = 0;
                      auVar132._0_8_ = ABS(local_468[lVar24 + lVar31 + local_390.nstride * 3]);
                      auVar132._8_8_ = ABS(local_438[lVar31 + local_390.nstride * 3]);
                      auVar170._0_8_ = dVar106 + dVar152 + 1e-100;
                      auVar170._8_8_ = dVar164 + dVar121 + 1e-100;
                      auVar154 = divpd(auVar132,auVar170);
                      dVar124 = auVar177._0_8_ + 1.0;
                      dVar151 = auVar177._8_8_ + 1.0;
                      dVar65 = (auVar156._0_8_ + dVar124) * dVar65;
                      dVar76 = (auVar156._8_8_ + dVar151) * dVar76;
                      dVar168 = ABS(local_438[lVar31 + local_390.nstride * 2]) /
                                (dVar164 + dVar115 + 1e-100) + 1.0;
                      local_568 = local_448[local_390.nstride * 7];
                      uStack_560 = 0;
                      auVar177._0_8_ =
                           dVar65 + (dVar173 + auVar156._0_8_) * dVar51 +
                           (dVar173 + auVar154._0_8_) * dVar106 +
                           (dVar124 + auVar154._0_8_) * dVar152 + 1e-100;
                      auVar177._8_8_ =
                           (auVar156._8_8_ + dVar168) * dVar115 + dVar76 +
                           (dVar151 + auVar154._8_8_) * dVar121 +
                           (dVar168 + auVar154._8_8_) * dVar164 + 1e-100;
                      auVar158._8_8_ = (double)local_580[lVar40 + lVar29] * dVar76;
                      auVar158._0_8_ = (double)local_578[lVar40 + lVar29] * dVar65;
                      auVar154 = divpd(auVar158,auVar177);
                      dStack_790 = auVar154._8_8_;
                      local_798 = dStack_790 +
                                  auVar97._8_8_ +
                                  ((double)local_6f8[lVar34 + lVar29] * dVar50) /
                                  ((dVar150 + dVar105) * dVar137 + dVar50 +
                                   (dVar75 + dVar167) * dVar95 + (dVar105 + dVar167) * dVar120 +
                                  1e-100) + (dVar48 * (double)local_6f8[lVar32 + lVar29]) /
                                            ((dVar94 + dVar64) * dVar149 + dVar48 +
                                             (dVar94 + dVar104) * dVar47 +
                                             (dVar72 + dVar104) * dVar63 + 1e-100) +
                                            ((double)local_6f8[lVar34 + lVar17] * dVar49) /
                                            (dVar49 + (dVar188 + dVar175) * dVar144 +
                                                      (dVar166 + dVar188) * dVar103 +
                                             (dVar175 + dVar74) * dVar73 + 1e-100) +
                                            ((double)local_6f8[lVar32 + lVar17] * dVar165) /
                                            (dVar165 + (dVar89 + dVar187) * dVar71 +
                                                       (dVar182 + dVar143) * dVar174 +
                                                       (dVar89 + dVar182) * dVar62 + 1e-100) +
                                            ((double)local_3b8[local_588] * dVar102) /
                                            ((dVar93 + dVar88) * dVar128 + dVar102 +
                                             (dVar70 + dVar136) * dVar46 +
                                             (dVar88 + dVar136) * dVar119 + 1e-100) +
                                            (dVar127 * (double)local_708[local_588]) /
                                            ((dVar69 + dVar61) * dVar101 + dVar127 +
                                             (dVar69 + dVar135) * dVar92 +
                                             (dVar87 + dVar135) * dVar118 + 1e-100) +
                                            ((double)local_700[local_588] * dVar45) /
                                            (dVar45 + (dVar117 + dVar86) * dVar126 +
                                                      (dVar68 + dVar117) * dVar91 +
                                             (dVar86 + dVar134) * dVar100 + 1e-100) +
                                            ((double)local_3a8[local_588] * dVar99) /
                                            (dVar99 + (dVar67 + dVar133) * dVar60 +
                                                      (dVar125 + dVar85) * dVar116 +
                                                      (dVar67 + dVar125) * dVar90 + 1e-100) +
                                            (double)local_6f8[lVar40 + local_588] + dVar54 + dVar55
                                            + dVar56 + dVar57 + dVar58 + dVar59 + auVar97._0_8_ +
                                  auVar154._0_8_;
                      dVar59 = ABS(local_390.p[lVar35 + lVar24 + lVar38 + local_390.nstride * 7]);
                      dVar76 = ABS(local_430[local_390.nstride * 7]);
                      auVar156._8_4_ = SUB84(dVar59,0);
                      auVar156._0_8_ = dVar59;
                      auVar156._12_4_ = (int)((ulong)dVar59 >> 0x20);
                      dVar54 = dVar59 + ABS(local_390.p
                                            [lVar35 + lVar20 + lVar38 + local_390.nstride * 7]);
                      dVar56 = auVar156._8_8_ + ABS(local_438[lVar38 + local_390.nstride * 7]);
                      local_508 = local_460[local_390.nstride * 4];
                      uStack_500 = 0;
                      auVar157._0_8_ =
                           ABS(local_390.p[lVar35 + lVar20 + lVar38 + local_390.nstride * 6]);
                      auVar157._8_8_ = ABS(local_438[lVar38 + local_390.nstride * 5]);
                      auVar82._0_8_ = dVar54 + 1e-100;
                      auVar82._8_8_ = dVar56 + 1e-100;
                      auVar158 = divpd(auVar157,auVar82);
                      local_7e8 = ABS(local_390.p[lVar35 + lVar23 + lVar38 + local_390.nstride * 7])
                      ;
                      dVar58 = ABS(local_460[local_390.nstride * 7]);
                      auVar147._8_4_ = SUB84(local_7e8,0);
                      auVar147._0_8_ = local_7e8;
                      auVar147._12_4_ = (int)((ulong)local_7e8 >> 0x20);
                      dVar55 = local_7e8 + ABS(local_7c8[local_390.nstride * 7]);
                      dVar57 = auVar147._8_8_ + ABS(local_440[local_390.nstride * 7]);
                      local_758 = local_7c0[lVar31 + local_390.nstride * 7];
                      uStack_750 = 0;
                      auVar145._0_8_ =
                           ABS(local_390.p[lVar35 + lVar23 + lVar38 + local_390.nstride * 6]);
                      auVar145._8_8_ = ABS(local_440[local_390.nstride * 5]);
                      auVar160._0_8_ = dVar55 + 1e-100;
                      auVar160._8_8_ = dVar57 + 1e-100;
                      auVar97 = divpd(auVar145,auVar160);
                      dStack_7e0 = auVar97._8_8_;
                      local_7e8 = (dStack_7e0 +
                                   ABS(local_440[local_390.nstride * 3]) /
                                   (ABS(local_440[local_390.nstride * 7]) + ABS(local_568) + dVar55
                                   + 1e-100) +
                                   ABS(local_460[local_390.nstride * 2]) /
                                   (ABS(local_458[local_390.nstride * 7]) + dVar55 + dVar58 + 1e-100
                                   ) + ABS(local_428[lVar31 + local_390.nstride]) /
                                       (dVar57 + dVar58 +
                                        ABS(local_428[lVar31 + local_390.nstride * 7]) + 1e-100) +
                                       1.0 + ABS(local_508) / (local_7e8 + dVar58 + 1e-100) +
                                  auVar97._0_8_) * local_7e8;
                      dVar61 = ABS(local_468[lVar24 + lVar38 + local_390.nstride * 7]);
                      dVar60 = ABS(local_468[lVar24 + lVar31 + local_390.nstride * 7]);
                      dVar45 = ABS(local_418[local_390.nstride * 7]) + dVar61;
                      dVar46 = dVar61 + ABS(local_420[lVar38 + local_390.nstride * 7]);
                      auVar129._0_8_ = ABS(local_468[lVar24 + lVar31 + local_390.nstride * 4]);
                      auVar129._8_8_ = ABS(local_418[local_390.nstride * 3]);
                      auVar109._0_8_ = dVar61 + dVar60 + 1e-100;
                      auVar109._8_8_ =
                           ABS(local_420[lVar38 + local_390.nstride * 7]) +
                           ABS(local_410[local_390.nstride * 7]) + dVar61 +
                           ABS(local_418[local_390.nstride * 7]) + 1e-100;
                      auVar130 = divpd(auVar129,auVar109);
                      auVar159._0_8_ = ABS(local_418[local_390.nstride * 6]);
                      auVar159._8_8_ = ABS(local_468[lVar24 + lVar38 + local_390.nstride * 5]);
                      auVar179._0_8_ = dVar45 + 1e-100;
                      auVar179._8_8_ = dVar46 + 1e-100;
                      auVar160 = divpd(auVar159,auVar179);
                      dVar57 = ABS(local_3e8[local_390.nstride * 7]);
                      dVar127 = ABS(local_3e0[local_390.nstride * 7]) + dVar57;
                      dVar62 = dVar57 + ABS(local_3d8[local_390.nstride * 7]);
                      dVar47 = ABS(local_468[lVar23 + lVar31 + local_390.nstride * 7]);
                      auVar84._8_4_ = SUB84(dVar57,0);
                      auVar84._0_8_ = dVar57;
                      auVar84._12_4_ = (int)((ulong)dVar57 >> 0x20);
                      auVar178._0_8_ = ABS(local_468[lVar23 + lVar31 + local_390.nstride * 4]);
                      auVar178._8_8_ = ABS(local_3e8[local_390.nstride * 3]);
                      auVar110._0_8_ = dVar47 + dVar57 + 1e-100;
                      auVar110._8_8_ =
                           ABS(local_3d8[local_390.nstride * 7]) +
                           ABS(local_3d0[local_390.nstride * 7]) +
                           ABS(local_3e0[local_390.nstride * 7]) + auVar84._8_8_ + 1e-100;
                      auVar179 = divpd(auVar178,auVar110);
                      auVar146._0_8_ = ABS(local_3e8[local_390.nstride * 6]);
                      auVar146._8_8_ = ABS(local_3e8[local_390.nstride * 5]);
                      auVar97._8_8_ = dVar62 + 1e-100;
                      auVar97._0_8_ = dVar127 + 1e-100;
                      auVar147 = divpd(auVar146,auVar97);
                      dVar48 = ABS(local_390.p[lVar35 + lVar24 + lVar37 + local_390.nstride * 7]);
                      dVar55 = ABS(local_548[local_390.nstride * 7]);
                      dVar49 = ABS(local_390.p[lVar35 + lVar24 + lVar30 + local_390.nstride * 7]);
                      auVar112._0_8_ = ABS(local_710[local_390.nstride * 2]);
                      auVar112._8_8_ = ABS(local_548[local_390.nstride]);
                      auVar180._8_4_ = SUB84(dVar48,0);
                      auVar180._0_8_ = dVar48;
                      auVar180._12_4_ = (int)((ulong)dVar48 >> 0x20);
                      auVar77._8_4_ = SUB84(dVar49,0);
                      auVar77._0_8_ = dVar49;
                      auVar77._12_4_ = (int)((ulong)dVar49 >> 0x20);
                      auVar181._0_8_ =
                           dVar48 + ABS(local_718[local_390.nstride * 7]) + dVar49 +
                           ABS(local_710[local_390.nstride * 7]) + 1e-100;
                      auVar181._8_8_ =
                           auVar180._8_8_ + ABS(local_558[local_390.nstride * 7]) + auVar77._8_8_ +
                           dVar55 + 1e-100;
                      auVar97 = divpd(auVar112,auVar181);
                      auVar131._0_8_ =
                           ABS(local_390.p[lVar35 + lVar24 + lVar30 + local_390.nstride * 4]);
                      auVar131._8_8_ = ABS(local_3c8[lVar30 + local_390.nstride * 3]);
                      dVar58 = dVar49 + ABS(local_710[local_390.nstride * 7]);
                      auVar138._0_8_ = dVar48 + dVar49 + 1e-100;
                      auVar138._8_8_ =
                           dVar55 + dVar58 + ABS(local_3c8[lVar30 + local_390.nstride * 7]) + 1e-100
                      ;
                      auVar132 = divpd(auVar131,auVar138);
                      auVar111._0_8_ = ABS(local_710[local_390.nstride * 6]);
                      auVar111._8_8_ = ABS(local_548[local_390.nstride * 5]);
                      auVar78._0_8_ = dVar58 + 1e-100;
                      auVar78._8_8_ = auVar77._8_8_ + dVar55 + 1e-100;
                      auVar112 = divpd(auVar111,auVar78);
                      dVar48 = ABS(local_408[local_390.nstride * 7]);
                      dVar65 = ABS(local_3f8[local_390.nstride * 7]);
                      dVar58 = ABS(local_428[lVar30 + local_390.nstride * 7]);
                      auVar140._8_4_ = SUB84(dVar48,0);
                      auVar140._0_8_ = dVar48;
                      auVar140._12_4_ = (int)((ulong)dVar48 >> 0x20);
                      auVar186._0_8_ = ABS(local_428[lVar30 + local_390.nstride]);
                      auVar186._8_8_ = ABS(local_3f8[local_390.nstride * 2]);
                      auVar163._0_8_ =
                           dVar58 + dVar65 + dVar48 + ABS(local_428[lVar37 + local_390.nstride * 7])
                           + 1e-100;
                      auVar163._8_8_ =
                           dVar65 + ABS(local_400[local_390.nstride * 7]) +
                                    auVar140._8_8_ + ABS(local_3f0[local_390.nstride * 7]) + 1e-100;
                      auVar177 = divpd(auVar186,auVar163);
                      auVar172._8_4_ = SUB84(dVar65,0);
                      auVar172._0_8_ = dVar65;
                      auVar172._12_4_ = (int)((ulong)dVar65 >> 0x20);
                      dVar55 = dVar65 + ABS(local_400[local_390.nstride * 7]);
                      auVar185._0_8_ = ABS(local_3f8[local_390.nstride * 4]);
                      auVar185._8_8_ = ABS(local_428[lVar30 + local_390.nstride * 3]);
                      auVar161._0_8_ = dVar65 + dVar48 + 1e-100;
                      auVar161._8_8_ =
                           ABS(local_3c0[lVar30 + local_390.nstride * 7]) + dVar55 + dVar58 + 1e-100
                      ;
                      auVar186 = divpd(auVar185,auVar161);
                      auVar139._0_8_ = ABS(local_3f8[local_390.nstride * 6]);
                      auVar139._8_8_ = ABS(local_428[lVar30 + local_390.nstride * 5]);
                      auVar52._0_8_ = dVar55 + 1e-100;
                      auVar52._8_8_ = auVar172._8_8_ + dVar58 + 1e-100;
                      auVar140 = divpd(auVar139,auVar52);
                      dVar50 = ABS(local_728[local_390.nstride * 7]);
                      dVar48 = ABS(local_528[local_390.nstride * 7]);
                      dVar55 = ABS(local_538[local_390.nstride * 7]);
                      dVar58 = ABS(local_468[lVar20 + lVar30 + local_390.nstride * 7]);
                      auVar141._8_4_ = SUB84(dVar55,0);
                      auVar141._0_8_ = dVar55;
                      auVar141._12_4_ = (int)((ulong)dVar55 >> 0x20);
                      auVar162._0_8_ = ABS(local_468[lVar20 + lVar30 + local_390.nstride * 2]);
                      auVar162._8_8_ = ABS(local_728[local_390.nstride]);
                      auVar142._0_8_ =
                           dVar55 + ABS(local_468[lVar20 + lVar37 + local_390.nstride * 7]) + dVar50
                           + dVar58 + 1e-100;
                      auVar142._8_8_ =
                           auVar141._8_8_ + ABS(local_720[local_390.nstride * 7]) + dVar48 + dVar50
                           + 1e-100;
                      auVar163 = divpd(auVar162,auVar142);
                      auVar66._0_8_ = ABS(local_728[local_390.nstride * 4]);
                      auVar66._8_8_ = ABS(local_468[lVar20 + lVar30 + local_390.nstride * 3]);
                      auVar148._0_8_ = dVar50 + dVar55 + 1e-100;
                      auVar148._8_8_ =
                           dVar48 + ABS(local_3b0[lVar30 + local_390.nstride * 7]) + dVar50 + dVar58
                           + 1e-100;
                      auVar156 = divpd(auVar66,auVar148);
                      auVar171._0_8_ = ABS(local_468[lVar20 + lVar30 + local_390.nstride * 6]);
                      auVar171._8_8_ = ABS(local_728[local_390.nstride * 5]);
                      auVar113._0_8_ = dVar58 + dVar50 + 1e-100;
                      auVar113._8_8_ = dVar50 + dVar48 + 1e-100;
                      auVar172 = divpd(auVar171,auVar113);
                      dVar51 = ABS(local_468[lVar23 + lVar37 + local_390.nstride * 7]);
                      dVar48 = ABS(local_7b8[lVar30 + local_390.nstride * 7]);
                      dVar55 = ABS(local_468[lVar23 + lVar30 + local_390.nstride * 7]);
                      dVar58 = ABS(local_7c0[lVar30 + local_390.nstride * 7]);
                      auVar53._0_8_ = ABS(local_468[lVar23 + lVar30 + local_390.nstride]);
                      auVar53._8_8_ = ABS(local_468[lVar23 + lVar30 + local_390.nstride * 2]);
                      auVar79._8_4_ = SUB84(dVar51,0);
                      auVar79._0_8_ = dVar51;
                      auVar79._12_4_ = (int)((ulong)dVar51 >> 0x20);
                      auVar80._8_4_ = SUB84(dVar55,0);
                      auVar80._0_8_ = dVar55;
                      auVar80._12_4_ = (int)((ulong)dVar55 >> 0x20);
                      auVar98._0_8_ =
                           dVar58 + dVar51 + ABS(local_7c0[lVar37 + local_390.nstride * 7]) + dVar55
                           + 1e-100;
                      auVar98._8_8_ =
                           dVar48 + auVar79._8_8_ + ABS(local_7b8[lVar37 + local_390.nstride * 7]) +
                           auVar80._8_8_ + 1e-100;
                      auVar154 = divpd(auVar53,auVar98);
                      auVar81._0_8_ = ABS(local_468[lVar23 + lVar30 + local_390.nstride * 4]);
                      auVar81._8_8_ = ABS(local_468[lVar23 + lVar30 + local_390.nstride * 3]);
                      auVar123._0_8_ = dVar51 + dVar55 + 1e-100;
                      auVar123._8_8_ =
                           dVar58 + ABS(local_3a0[lVar30 + local_390.nstride * 7]) + dVar48 +
                           auVar80._8_8_ + 1e-100;
                      auVar82 = divpd(auVar81,auVar123);
                      auVar83._0_8_ = ABS(local_468[lVar23 + lVar30 + local_390.nstride * 6]);
                      auVar83._8_8_ = ABS(local_468[lVar23 + lVar30 + local_390.nstride * 5]);
                      auVar114._0_8_ = dVar48 + dVar55 + 1e-100;
                      auVar114._8_8_ = dVar55 + dVar58 + 1e-100;
                      auVar84 = divpd(auVar83,auVar114);
                      dVar54 = ((auVar84._8_8_ +
                                 auVar82._8_8_ + auVar154._8_8_ + auVar154._0_8_ + 1.0 +
                                 auVar82._0_8_ + auVar84._0_8_) * dVar55 * (double)local_3a8[lVar17]
                                * local_468[lVar23 + lVar30 + local_390.nstride * 8] +
                               (auVar172._8_8_ +
                                auVar156._8_8_ + auVar163._8_8_ + 1.0 + auVar163._0_8_ +
                                auVar156._0_8_ + auVar172._0_8_) * dVar50 *
                               (double)local_700[lVar17] *
                               local_468[lVar20 + lVar30 + local_390.nstride * 8] +
                               (auVar140._8_8_ +
                                auVar186._8_8_ + auVar177._8_8_ + auVar177._0_8_ + 1.0 +
                                auVar186._0_8_ + auVar140._0_8_) * dVar65 *
                               (double)local_708[lVar17] * local_428[lVar30 + local_390.nstride * 8]
                               + (auVar112._8_8_ +
                                  auVar132._8_8_ + auVar97._8_8_ + 1.0 + auVar97._0_8_ +
                                  auVar132._0_8_ + auVar112._0_8_) * dVar49 *
                                 (double)local_3b8[lVar17] *
                                 local_3c8[lVar30 + local_390.nstride * 8] +
                                 (auVar147._8_8_ +
                                  auVar179._8_8_ +
                                  ABS(local_468[lVar23 + lVar31 + local_390.nstride * 2]) /
                                  (ABS(local_7b8[lVar31 + local_390.nstride * 7]) + dVar127 + dVar47
                                  + 1e-100) +
                                  ABS(local_468[lVar23 + lVar31 + local_390.nstride]) /
                                  (dVar62 + ABS(local_758) + dVar47 + 1e-100) + 1.0 + auVar179._0_8_
                                 + auVar147._0_8_) * dVar57 * (double)local_3a8[lVar29] *
                                 local_468[lVar23 + lVar31 + local_390.nstride * 8] +
                                 (auVar160._8_8_ +
                                  auVar130._8_8_ +
                                  ABS(local_468[lVar20 + lVar31 + local_390.nstride * 2]) /
                                  (dVar60 + dVar45 +
                                   ABS(local_468[lVar20 + lVar31 + local_390.nstride * 7]) + 1e-100)
                                  + ABS(local_468[lVar24 + lVar31 + local_390.nstride]) /
                                    (dVar46 + ABS(local_420[lVar31 + local_390.nstride * 7]) +
                                     dVar60 + 1e-100) + 1.0 + auVar130._0_8_ + auVar160._0_8_) *
                                 dVar61 * (double)local_700[lVar29] *
                                 local_468[lVar20 + lVar31 + local_390.nstride * 8] +
                                 local_7e8 * (double)local_708[lVar29] *
                                 local_428[lVar31 + local_390.nstride * 8] +
                                 (auVar158._8_8_ +
                                  ABS(local_450[local_390.nstride * 3]) /
                                  (ABS(local_438[lVar38 + local_390.nstride * 7]) + dVar54 +
                                   ABS(local_450[local_390.nstride * 7]) + 1e-100) +
                                  ABS(local_390.p[lVar35 + lVar20 + lVar31 + local_390.nstride * 2])
                                  / (dVar76 + dVar54 +
                                     ABS(local_390.p
                                         [lVar35 + lVar20 + lVar31 + local_390.nstride * 7]) +
                                    1e-100) +
                                  ABS(local_438[lVar31 + local_390.nstride]) /
                                  (dVar56 + dVar76 + ABS(local_518) + 1e-100) + 1.0 +
                                  ABS(local_430[local_390.nstride * 4]) / (dVar59 + dVar76 + 1e-100)
                                 + auVar158._0_8_) * dVar59 * (double)local_3b8[lVar29] *
                                 local_3c8[lVar31 + local_390.nstride * 8] + local_798) * 0.125;
                      local_398 = lVar19;
                    }
                    *(double *)(local_598 + (lVar19 - local_498) * 8) = dVar54;
                    lVar19 = lVar19 + 1;
                  } while (local_6dc != (int)lVar19);
                }
                local_738 = local_738 + 1;
              } while (local_6e0 != (int)local_738);
            }
            uVar13 = (uint)local_740 + 1;
            bVar44 = (uint)local_740 != local_804.bigend.vect[2];
            local_740 = (ulong)uVar13;
          } while (bVar44);
        }
      }
      MFIter::operator++((MFIter *)&local_350);
    } while (local_350.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0] <
             local_350.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]);
  }
  MFIter::~MFIter((MFIter *)&local_350);
  local_638._1_7_ = 0;
  local_638[0] = true;
  local_638._8_4_ = 0;
  local_638._12_4_ = 0;
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_628.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.p = (double *)&PTR__FabFactory_008378d0;
  MultiFab::MultiFab((MultiFab *)&local_350,
                     &(((FabArray<amrex::FArrayBox> *)&local_748->super_FabArrayBase)->
                      super_FabArrayBase).boxarray,
                     &(((FabArray<amrex::FArrayBox> *)&local_748->super_FabArrayBase)->
                      super_FabArrayBase).distributionMap,1,0,(MFInfo *)local_638,
                     (FabFactory<amrex::FArrayBox> *)&local_6d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_628);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&local_350,0.0,0,local_350.super_FabArrayBase.n_comp,
             &local_350.super_FabArrayBase.n_grow);
  PVar189 = Geometry::periodicity(local_4f8);
  local_638[0] = PVar189.period.vect[0]._0_1_;
  local_638._1_7_ = PVar189.period.vect._1_7_;
  local_638._8_4_ = PVar189.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy
            (&local_350,(FabArray<amrex::FArrayBox> *)local_1b8,(Periodicity *)local_638,COPY);
  local_7b0._M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
       (local_788->super_MLNodeLinOp).m_nd_fine_mask.
       super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[local_5d8]._M_t.
       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t;
  local_7a8._M_head_impl =
       *(LayoutData<int> **)
        &(local_788->super_MLNodeLinOp).m_has_fine_bndry.
         super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_5d8]._M_t.
         super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
  ;
  local_1cc.num_streams = Gpu::Device::max_gpu_streams;
  local_1cc.do_tiling = true;
  local_1cc.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_1cc.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_1cc.tilesize.vect[2] = DAT_0083cec0;
  local_1cc.dynamic = true;
  local_1cc.device_sync = true;
  MFIter::MFIter((MFIter *)local_638,&local_748->super_FabArrayBase,&local_1cc);
  if ((int)local_628.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_610) {
    do {
      ppbVar21 = &local_628.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_5f8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar21 = (pointer *)
                   ((local_5f8->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start +
                   (int)local_628.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (*(int *)(*(long *)&((local_7a8._M_head_impl)->m_data).
                             super_vector<int,_std::allocator<int>_> + (long)*(int *)ppbVar21 * 4)
          != 0) {
        MFIter::tilebox(&local_804,(MFIter *)local_638);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_6d8,local_748,(MFIter *)local_638);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_698,&local_350,(MFIter *)local_638);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_390,
                   (FabArray<amrex::IArrayBox> *)
                   local_7b0._M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                   (MFIter *)local_638);
        if (local_804.smallend.vect[2] <= local_804.bigend.vect[2]) {
          local_770 = (ulong)(uint)local_804.bigend.vect[1];
          local_7a0 = (long)local_804.smallend.vect[0];
          local_778 = local_7a0 * 4;
          local_768 = local_7a0 * 8;
          uVar13 = local_804.smallend.vect[2];
          do {
            if (local_804.smallend.vect[1] <= local_804.bigend.vect[1]) {
              local_760 = (long)(int)uVar13;
              lVar17 = (long)local_390.p +
                       ((long)local_804.smallend.vect[1] - (long)local_390.begin.y) *
                       local_390.jstride * 4 +
                       (local_760 - local_390.begin.z) * local_390.kstride * 4 +
                       (long)local_390.begin.x * -4 + local_778;
              lVar19 = (long)local_804.smallend.vect[1];
              do {
                if (local_804.smallend.vect[0] <= local_804.bigend.vect[0]) {
                  lVar18 = 0;
                  do {
                    if (*(int *)(lVar17 + lVar18 * 4) == 2) {
                      local_6d8.p
                      [local_7a0 +
                       (((lVar19 - local_6d8.begin.y) * local_6d8.jstride +
                        (local_760 - local_6d8.begin.z) * local_6d8.kstride + lVar18) -
                       (long)local_6d8.begin.x)] =
                           (double)local_698.p
                                   [local_7a0 +
                                    (((lVar19 - local_698.begin.y) * local_698.jstride +
                                     (local_760 - local_698.begin.z) * local_698.kstride + lVar18) -
                                    (long)local_698.begin.x)];
                    }
                    lVar18 = lVar18 + 1;
                  } while ((local_804.bigend.vect[0] - local_804.smallend.vect[0]) + 1 !=
                           (int)lVar18);
                }
                lVar19 = lVar19 + 1;
                lVar17 = lVar17 + local_390.jstride * 4;
              } while (local_804.bigend.vect[1] + 1U != (int)lVar19);
            }
            bVar44 = uVar13 != local_804.bigend.vect[2];
            uVar13 = uVar13 + 1;
          } while (bVar44);
        }
      }
      MFIter::operator++((MFIter *)local_638);
    } while ((int)local_628.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_610);
  }
  MFIter::~MFIter((MFIter *)local_638);
  MultiFab::~MultiFab((MultiFab *)&local_350);
  MultiFab::~MultiFab((MultiFab *)local_1b8);
  if (local_7d0 != (FabArray<amrex::FArrayBox> *)0x0) {
    (*(((FabArray<amrex::FArrayBox> *)&local_7d0->super_FabArrayBase)->super_FabArrayBase).
      _vptr_FabArrayBase[1])();
  }
  return;
}

Assistant:

void
MLNodeLaplacian::restrictInteriorNodes (int camrlev, MultiFab& crhs, MultiFab& a_frhs) const
{
    const BoxArray& fba = a_frhs.boxArray();
    const DistributionMapping& fdm = a_frhs.DistributionMap();
    const int amrrr = AMRRefRatio(camrlev);

    MultiFab* frhs = nullptr;
    std::unique_ptr<MultiFab> mf;
    if (a_frhs.nGrowVect().allGE(IntVect(amrrr-1)))
    {
        frhs = &a_frhs;
    }
    else
    {
        mf = std::make_unique<MultiFab>(fba, fdm, 1, amrrr-1);
        frhs = mf.get();
        MultiFab::Copy(*frhs, a_frhs, 0, 0, 1, 0);
    }

    const Geometry& cgeom = m_geom[camrlev  ][0];
    const Geometry& fgeom = m_geom[camrlev+1][0];

    const Box& f_nd_domain = amrex::surroundingNodes(fgeom.Domain());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    const iMultiFab& fdmsk = *m_dirichlet_mask[camrlev+1][0];
    const auto& stencil    =  m_nosigma_stencil[camrlev+1];

    MultiFab cfine(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    frhs->setBndry(0.0);
    frhs->FillBoundary(fgeom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cfine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& cfab = cfine.array(mfi);
        Array4<Real const> const& ffab = frhs->const_array(mfi);
        Array4<int const> const& mfab = fdmsk.const_array(mfi);
        if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<2>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<4>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            }
        } else {
            Array4<Real const> const& stfab = stencil->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
            });
        }
    }

    MultiFab tmp_crhs(crhs.boxArray(), crhs.DistributionMap(), 1, 0);
    tmp_crhs.setVal(0.0);
    tmp_crhs.ParallelCopy(cfine, cgeom.periodicity());

    const iMultiFab& c_nd_mask = *m_nd_fine_mask[camrlev];
    const auto& has_fine_bndry = *m_has_fine_bndry[camrlev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crhs, mfi_info); mfi.isValid(); ++mfi)
    {
        if (has_fine_bndry[mfi])
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& dfab = crhs.array(mfi);
            Array4<Real const> const& sfab = tmp_crhs.const_array(mfi);
            Array4<int const> const& mfab = c_nd_mask.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
            {
                if (mfab(i,j,k) == fine_node) dfab(i,j,k) = sfab(i,j,k);
            });
        }
    }
}